

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O3

void __thiscall
cppqc::StatelessGenerator<std::array<bool,5ul>>::
StatelessGenerator<cppqc::detail::ArrayOfStatelessGenerator<bool,5ul>>
          (StatelessGenerator<std::array<bool,5ul>> *this,ArrayOfStatelessGenerator<bool,_5UL> *gm)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  plVar2 = (long *)(**(code **)(*(long *)(gm->m_gen).m_gen._M_t.
                                         super___uniq_ptr_impl<cppqc::detail::StatelessGenConcept<bool>,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
                                         .
                                         super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_false>
                               + 0x20))();
  *puVar1 = &PTR__StatelessGenModel_00116c28;
  uVar3 = (**(code **)(*plVar2 + 0x20))(plVar2);
  puVar1[1] = uVar3;
  *(undefined8 **)this = puVar1;
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

StatelessGenerator(const StatelessGeneratorModel& gm)
      : m_gen{new StatelessGenModel<StatelessGeneratorModel>(gm)} {}